

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestIterationStart
          (StreamingListener *this,UnitTest *param_1,int iteration)

{
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  UnitTest *pUStack_18;
  int iteration_local;
  UnitTest *param_1_local;
  StreamingListener *this_local;
  
  local_1c = iteration;
  pUStack_18 = param_1;
  param_1_local = (UnitTest *)this;
  StreamableToString<int>(&local_60,&local_1c);
  std::operator+(&local_40,"event=TestIterationStart&iteration=",&local_60);
  SendLn(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void OnTestIterationStart(const UnitTest& /* unit_test */, int iteration) {
    SendLn("event=TestIterationStart&iteration=" +
           StreamableToString(iteration));
  }